

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Data_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Data_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference this_00;
  FixedDatum *pFVar3;
  reference this_01;
  VariableDatum *pVVar4;
  KString local_290;
  KString local_270;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
  local_250;
  const_iterator citrVarEnd;
  const_iterator citrVar;
  KString local_220;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>_>
  local_200;
  const_iterator citrFixedEnd;
  const_iterator citrFixed;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Data_PDU *local_18;
  Data_PDU *this_local;
  
  local_18 = this;
  this_local = (Data_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Data PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            ((KString *)&citrFixed,(Simulation_Management_Header *)this);
  poVar2 = std::operator<<(poVar2,(string *)&citrFixed);
  poVar2 = std::operator<<(poVar2,"Request ID:            ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32RequestID);
  poVar2 = std::operator<<(poVar2,"\nNumber Fixed Datum:    ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->super_Comment_PDU).m_ui32NumFixedDatum)
  ;
  poVar2 = std::operator<<(poVar2,"\nNumber Variable Datum: ");
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(this->super_Comment_PDU).m_ui32NumVariableDatum);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citrFixed);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::operator<<(local_190,"Fixed Datum\n");
  citrFixedEnd = std::
                 vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
                 ::begin(&(this->super_Comment_PDU).m_vFixedDatum);
  local_200._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::FixedDatum> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>
       ::end(&(this->super_Comment_PDU).m_vFixedDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrFixedEnd,&local_200);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>_>
              ::operator*(&citrFixedEnd);
    pFVar3 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>::operator->(this_00);
    (*(pFVar3->super_DataTypeBase)._vptr_DataTypeBase[2])(&citrVar);
    UTILS::IndentString(&local_220,(KString *)&citrVar,1,'\t');
    std::operator<<(local_190,(string *)&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&citrVar);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::FixedDatum>_>_>_>
    ::operator++(&citrFixedEnd);
  }
  std::operator<<(local_190,"Variable Datum\n");
  citrVarEnd = std::
               vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
               ::begin(&(this->super_Comment_PDU).m_vVariableDatum);
  local_250._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
       ::end(&(this->super_Comment_PDU).m_vVariableDatum);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrVarEnd,&local_250);
    if (!bVar1) break;
    this_01 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
              ::operator*(&citrVarEnd);
    pVVar4 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::operator->(this_01);
    (*(pVVar4->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_290);
    UTILS::IndentString(&local_270,&local_290,1,'\t');
    std::operator<<(local_190,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
    ::operator++(&citrVarEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Data_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Data PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "Request ID:            "   << m_ui32RequestID
       << "\nNumber Fixed Datum:    " << m_ui32NumFixedDatum
       << "\nNumber Variable Datum: " << m_ui32NumVariableDatum
       << "\n";

    ss << "Fixed Datum\n";
    vector<FixDtmPtr>::const_iterator citrFixed = m_vFixedDatum.begin();
    vector<FixDtmPtr>::const_iterator citrFixedEnd = m_vFixedDatum.end();
    for( ; citrFixed != citrFixedEnd; ++citrFixed )
    {
        ss << IndentString( ( *citrFixed )->GetAsString() );
    }

    ss << "Variable Datum\n";
    vector<VarDtmPtr>::const_iterator citrVar = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrVarEnd = m_vVariableDatum.end();
    for( ; citrVar != citrVarEnd; ++citrVar )
    {
        ss << IndentString( ( *citrVar )->GetAsString() );
    }

    return ss.str();
}